

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

char * format_telnet_command(SockAddr *addr,int port,Conf *conf,uint *flags_out)

{
  uchar val;
  char *pcVar1;
  strbuf *buf_o;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  BinarySink *bs;
  long lVar13;
  uint uVar14;
  uint local_26c;
  char dest [512];
  
  pcVar1 = conf_get_str(conf,0x12);
  buf_o = strbuf_new();
  bs = buf_o->binarysink_;
  local_26c = 0;
  uVar10 = 0;
LAB_0014273c:
  do {
    iVar9 = (int)uVar10;
    lVar2 = (long)iVar9;
    cVar5 = pcVar1[lVar2];
    if (cVar5 == '\0') {
LAB_00142b86:
      if (flags_out != (uint *)0x0) {
        *flags_out = local_26c;
      }
      pcVar1 = strbuf_to_str(buf_o);
      return pcVar1;
    }
    pcVar3 = pcVar1 + lVar2;
    lVar13 = lVar2 << 0x20;
    uVar14 = iVar9 + 3;
    lVar12 = 0;
    iVar7 = iVar9;
    while( true ) {
      iVar7 = iVar7 + 1;
      iVar11 = (int)lVar12;
      if (cVar5 == '\0') {
        if (iVar11 == 0) goto LAB_00142b86;
        iVar7 = iVar11 + iVar9;
        goto LAB_00142b75;
      }
      if ((cVar5 == '%') || (cVar5 == '\\')) break;
      cVar5 = pcVar3[lVar12 + 1];
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x100000000;
      uVar14 = uVar14 + 1;
    }
    if (iVar11 != 0) {
      BinarySink_put_data(bs,pcVar3,(long)iVar11);
    }
    uVar10 = uVar10 + lVar12 + 1;
    cVar5 = pcVar1[(int)uVar10];
    if (cVar5 == '\0') {
      lVar2 = lVar13 >> 0x20;
      iVar7 = iVar11 + iVar9 + 1;
      iVar9 = iVar9 + iVar11;
LAB_00142b75:
      BinarySink_put_data(bs,pcVar1 + lVar2,(long)(iVar7 - iVar9));
      goto LAB_00142b86;
    }
    if (pcVar3[lVar12] == '\\') {
      if (cVar5 == '%') {
        val = '%';
      }
      else {
        if ((cVar5 == 'X') || (cVar5 == 'x')) {
          pcVar3 = pcVar1 + (long)iVar7 + 1;
          bVar6 = false;
          bVar8 = 0;
          while( true ) {
            cVar5 = *pcVar3;
            if ((byte)(cVar5 - 0x30U) < 10) {
              bVar8 = cVar5 - 0x30U | bVar8;
            }
            else if ((byte)(cVar5 + 0x9fU) < 6) {
              bVar8 = cVar5 + bVar8 + 0xa9;
            }
            else {
              if (5 < (byte)(cVar5 + 0xbfU)) {
                BinarySink_put_byte(bs,'\\');
                uVar10 = uVar10 & 0xffffffff;
                goto LAB_0014273c;
              }
              bVar8 = (cVar5 + bVar8) - 0x37;
            }
            if (bVar6) break;
            bVar8 = bVar8 << 4;
            uVar14 = uVar14 + 1;
            pcVar3 = pcVar3 + 1;
            bVar6 = true;
          }
          BinarySink_put_byte(bs,bVar8);
          uVar10 = (ulong)uVar14;
          goto LAB_0014273c;
        }
        if (cVar5 == 'n') {
          val = '\n';
        }
        else if (cVar5 == 'r') {
          val = '\r';
        }
        else {
          if (cVar5 != 't') {
            if (cVar5 == '\\') {
              BinarySink_put_byte(bs,'\\');
            }
            else {
              BinarySink_put_data(bs,pcVar3 + lVar12,2);
            }
            uVar10 = (ulong)(iVar9 + iVar11 + 2);
            goto LAB_0014273c;
          }
          val = '\t';
        }
      }
      BinarySink_put_byte(bs,val);
      uVar10 = (ulong)(iVar9 + iVar11 + 2);
      goto LAB_0014273c;
    }
    if (cVar5 == '%') {
      BinarySink_put_byte(bs,'%');
      uVar10 = (ulong)(iVar9 + iVar11 + 2);
      goto LAB_0014273c;
    }
    pcVar3 = pcVar1 + (int)uVar10;
    iVar7 = strncasecmp(pcVar3,"host",4);
    if (iVar7 == 0) {
      sk_getaddr(addr,dest,0x200);
      sVar4 = strlen(dest);
      BinarySink_put_data(bs,dest,sVar4);
    }
    else {
      iVar7 = strncasecmp(pcVar3,"port",4);
      if (iVar7 != 0) {
        iVar7 = strncasecmp(pcVar3,"user",4);
        if (iVar7 == 0) {
          pcVar3 = conf_get_str(conf,0x10);
          sVar4 = strlen(pcVar3);
          BinarySink_put_data(bs,pcVar3,sVar4);
          uVar10 = (ulong)(iVar9 + iVar11 + 5);
          local_26c = local_26c | *pcVar3 == '\0';
        }
        else {
          iVar7 = strncasecmp(pcVar3,"pass",4);
          if (iVar7 != 0) {
            iVar7 = strncasecmp(pcVar3,"proxyhost",9);
            if (iVar7 == 0) {
              pcVar3 = conf_get_str(conf,0xe);
              sVar4 = strlen(pcVar3);
              BinarySink_put_data(bs,pcVar3,sVar4);
            }
            else {
              iVar7 = strncasecmp(pcVar3,"proxyport",9);
              if (iVar7 != 0) {
                BinarySink_put_byte(bs,'%');
                uVar10 = uVar10 & 0xffffffff;
                goto LAB_0014273c;
              }
              uVar14 = conf_get_int(conf,0xf);
              BinarySink_put_fmt(bs,"%d",(ulong)uVar14);
            }
            uVar10 = (ulong)(iVar9 + iVar11 + 10);
            goto LAB_0014273c;
          }
          pcVar3 = conf_get_str(conf,0x11);
          sVar4 = strlen(pcVar3);
          BinarySink_put_data(bs,pcVar3,sVar4);
          uVar10 = (ulong)(iVar9 + iVar11 + 5);
          if (*pcVar3 == '\0') {
            local_26c = local_26c | 2;
          }
        }
        goto LAB_0014273c;
      }
      BinarySink_put_fmt(bs,"%d",(ulong)(uint)port);
    }
    uVar10 = (ulong)(iVar9 + iVar11 + 5);
  } while( true );
}

Assistant:

char *format_telnet_command(SockAddr *addr, int port, Conf *conf,
                            unsigned *flags_out)
{
    char *fmt = conf_get_str(conf, CONF_proxy_telnet_command);
    int so = 0, eo = 0;
    strbuf *buf = strbuf_new();
    unsigned flags = 0;

    /* we need to escape \\, \%, \r, \n, \t, \x??, \0???,
     * %%, %host, %port, %user, and %pass
     */

    while (fmt[eo] != 0) {

        /* scan forward until we hit end-of-line,
         * or an escape character (\ or %) */
        while (fmt[eo] != 0 && fmt[eo] != '%' && fmt[eo] != '\\')
            eo++;

        /* if we hit eol, break out of our escaping loop */
        if (fmt[eo] == 0) break;

        /* if there was any unescaped text before the escape
         * character, send that now */
        if (eo != so)
            put_data(buf, fmt + so, eo - so);

        so = eo++;

        /* if the escape character was the last character of
         * the line, we'll just stop and send it. */
        if (fmt[eo] == 0) break;

        if (fmt[so] == '\\') {

            /* we recognize \\, \%, \r, \n, \t, \x??.
             * anything else, we just send unescaped (including the \).
             */

            switch (fmt[eo]) {

              case '\\':
                put_byte(buf, '\\');
                eo++;
                break;

              case '%':
                put_byte(buf, '%');
                eo++;
                break;

              case 'r':
                put_byte(buf, '\r');
                eo++;
                break;

              case 'n':
                put_byte(buf, '\n');
                eo++;
                break;

              case 't':
                put_byte(buf, '\t');
                eo++;
                break;

              case 'x':
              case 'X': {
                /* escaped hexadecimal value (ie. \xff) */
                unsigned char v = 0;
                int i = 0;

                for (;;) {
                  eo++;
                  if (fmt[eo] >= '0' && fmt[eo] <= '9')
                      v += fmt[eo] - '0';
                  else if (fmt[eo] >= 'a' && fmt[eo] <= 'f')
                      v += fmt[eo] - 'a' + 10;
                  else if (fmt[eo] >= 'A' && fmt[eo] <= 'F')
                      v += fmt[eo] - 'A' + 10;
                  else {
                    /* non hex character, so we abort and just
                     * send the whole thing unescaped (including \x)
                     */
                    put_byte(buf, '\\');
                    eo = so + 1;
                    break;
                  }

                  /* we only extract two hex characters */
                  if (i == 1) {
                    put_byte(buf, v);
                    eo++;
                    break;
                  }

                  i++;
                  v <<= 4;
                }
                break;
              }

              default:
                put_data(buf, fmt + so, 2);
                eo++;
                break;
            }
        } else {

            /* % escape. we recognize %%, %host, %port, %user, %pass.
             * %proxyhost, %proxyport. Anything else we just send
             * unescaped (including the %).
             */

            if (fmt[eo] == '%') {
                put_byte(buf, '%');
                eo++;
            }
            else if (strnicmp(fmt + eo, "host", 4) == 0) {
                char dest[512];
                sk_getaddr(addr, dest, lenof(dest));
                put_data(buf, dest, strlen(dest));
                eo += 4;
            }
            else if (strnicmp(fmt + eo, "port", 4) == 0) {
                put_fmt(buf, "%d", port);
                eo += 4;
            }
            else if (strnicmp(fmt + eo, "user", 4) == 0) {
                const char *username = conf_get_str(conf, CONF_proxy_username);
                put_data(buf, username, strlen(username));
                eo += 4;
                if (!*username)
                    flags |= TELNET_CMD_MISSING_USERNAME;
            }
            else if (strnicmp(fmt + eo, "pass", 4) == 0) {
                const char *password = conf_get_str(conf, CONF_proxy_password);
                put_data(buf, password, strlen(password));
                eo += 4;
                if (!*password)
                    flags |= TELNET_CMD_MISSING_PASSWORD;
            }
            else if (strnicmp(fmt + eo, "proxyhost", 9) == 0) {
                const char *host = conf_get_str(conf, CONF_proxy_host);
                put_data(buf, host, strlen(host));
                eo += 9;
            }
            else if (strnicmp(fmt + eo, "proxyport", 9) == 0) {
                int port = conf_get_int(conf, CONF_proxy_port);
                put_fmt(buf, "%d", port);
                eo += 9;
            }
            else {
                /* we don't escape this, so send the % now, and
                 * don't advance eo, so that we'll consider the
                 * text immediately following the % as unescaped.
                 */
                put_byte(buf, '%');
            }
        }

        /* resume scanning for additional escapes after this one. */
        so = eo;
    }

    /* if there is any unescaped text at the end of the line, send it */
    if (eo != so) {
        put_data(buf, fmt + so, eo - so);
    }

    if (flags_out)
        *flags_out = flags;
    return strbuf_to_str(buf);
}